

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingNegativeCase::init
          (LayoutBindingNegativeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  ShaderType SVar2;
  ErrorType EVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  ContextType ctxType;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar11;
  NotSupportedError *this_00;
  int iVar12;
  iterator iVar13;
  uint uVar14;
  GLint binding;
  GLint maxTessCtrlUnits;
  GLint maxFragmentUnits;
  GLint maxVertexUnits;
  GLint maxTessEvalUnits;
  GLint maxCombinedUnits;
  GLint numBindingPoints;
  Random rnd;
  Random rnd_1;
  uint local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  vector<int,_std::allocator<int>_> *local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar10;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_1c0,dVar8 ^ 0xff23a4);
  local_1cc = 0;
  local_1dc = 0;
  local_1e0 = 0;
  local_1d0 = 0;
  local_1e4 = 0;
  local_1d4 = 0;
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_tessellation_shader")
  ;
  bVar6 = true;
  if (!bVar5) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  }
  this->m_tessSupport = bVar6;
  iVar7 = 4;
  if ((bVar6 == false) &&
     (iVar7 = 2, (this->m_shaderType & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_TESS_CONTROL)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Tesselation shaders not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x309);
    goto LAB_01486297;
  }
  (**(code **)(lVar10 + 0x868))(this->m_maxVertexUnitsEnum,&local_1dc);
  (**(code **)(lVar10 + 0x868))(this->m_maxFragmentUnitsEnum,&local_1e0);
  if (this->m_tessSupport == true) {
    (**(code **)(lVar10 + 0x868))(this->m_maxTessCtrlUnitsEnum,&local_1e4);
    (**(code **)(lVar10 + 0x868))(this->m_maxTessEvalUnitsEnum,&local_1d4);
  }
  (**(code **)(lVar10 + 0x868))(this->m_maxCombinedUnitsEnum,&local_1d0);
  (**(code **)(lVar10 + 0x868))(this->m_maxBindingPointEnum,&local_1cc);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"Querying available uniform numbers failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x318);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Maximum units for uniform type in the vertex shader: ",0x35);
  std::ostream::operator<<(poVar1,local_1dc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Maximum units for uniform type in the fragment shader: ",0x37);
  std::ostream::operator<<(poVar1,local_1e0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (this->m_tessSupport == true) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Maximum units for uniform type in the tessellation control shader: ",0x43);
    std::ostream::operator<<(poVar1,local_1e4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Maximum units for uniform type in the tessellation evaluation shader: ",0x46);
    std::ostream::operator<<(poVar1,local_1e4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Maximum combined units for uniform type: ",0x29);
  std::ostream::operator<<(poVar1,local_1d0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Maximum binding point for uniform type: ",0x28);
  std::ostream::operator<<(poVar1,local_1cc + -1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  iVar12 = local_1d4;
  switch(this->m_shaderType) {
  case SHADERTYPE_VERTEX:
    iVar12 = local_1dc;
    break;
  case SHADERTYPE_FRAGMENT:
    iVar12 = local_1e0;
    break;
  case SHADERTYPE_TESS_CONTROL:
    iVar12 = local_1e4;
    break;
  case SHADERTYPE_TESS_EVALUATION:
    break;
  case SHADERTYPE_ALL:
    iVar4 = local_1e0;
    if (local_1dc < local_1e0) {
      iVar4 = local_1dc;
    }
    if (local_1e4 < local_1d4) {
      iVar12 = local_1e4;
    }
    if (iVar4 < iVar12) {
      iVar12 = iVar4;
    }
    if (local_1d0 / iVar7 <= iVar12) {
      iVar12 = local_1d0 / iVar7;
    }
    break;
  default:
    iVar12 = 0;
  }
  if (this->m_testType - TESTTYPE_BINDING_MULTIPLE < 3) {
    if (this->m_errorType == ERRORTYPE_CONTRADICTORY) {
      if (iVar12 < 3) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_00,"Not enough uniforms available for test",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x350);
        goto LAB_01486297;
      }
      iVar7 = 8;
      if (iVar12 < 8) {
        iVar7 = iVar12;
      }
      uVar9 = deRandom_getUint32(&local_1c0);
      uVar14 = iVar7 - 2;
    }
    else {
      if (iVar12 < 2) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_00,"Not enough uniforms available for test",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x356);
        goto LAB_01486297;
      }
      iVar7 = 7;
      if (iVar12 < 7) {
        iVar7 = iVar12;
      }
      uVar9 = deRandom_getUint32(&local_1c0);
      uVar14 = iVar7 - 1;
    }
    iVar7 = uVar9 % uVar14 + 2;
LAB_01485b74:
    this->m_numBindings = iVar7;
  }
  else {
    iVar7 = 1;
    if (this->m_testType < TESTTYPE_BINDING_MULTIPLE) goto LAB_01485b74;
  }
  iVar7 = local_1cc;
  SVar2 = this->m_shaderType;
  if (SVar2 == SHADERTYPE_ALL) {
LAB_01485b8e:
    if (local_1dc < this->m_numBindings) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Vertex shader: not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x361);
      goto LAB_01486297;
    }
    if ((SVar2 == SHADERTYPE_ALL) || (SVar2 == SHADERTYPE_FRAGMENT)) goto LAB_01485ba8;
  }
  else if (SVar2 == SHADERTYPE_FRAGMENT) {
LAB_01485ba8:
    if (local_1e0 < this->m_numBindings) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Fragment shader: not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x364);
      goto LAB_01486297;
    }
  }
  else if (SVar2 == SHADERTYPE_VERTEX) goto LAB_01485b8e;
  if (this->m_tessSupport == true) {
    if (((SVar2 == SHADERTYPE_ALL) || (SVar2 == SHADERTYPE_TESS_CONTROL)) &&
       (local_1e4 < this->m_numBindings)) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Tessellation control shader: not enough uniforms available for test",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x367);
      goto LAB_01486297;
    }
    if ((SVar2 - SHADERTYPE_TESS_EVALUATION < 2) && (local_1d4 < this->m_numBindings)) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Tessellation evaluation shader: not enough uniforms available for test",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x36a);
      goto LAB_01486297;
    }
  }
  if ((SVar2 == SHADERTYPE_ALL) && (local_1d0 < this->m_numBindings << bVar6 + 1)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Not enough uniforms available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x36d);
LAB_01486297:
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (local_1cc < this->m_numBindings) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Not enough binding points available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x371);
    goto LAB_01486297;
  }
  if ((local_1cc == this->m_numBindings) && (this->m_errorType == ERRORTYPE_CONTRADICTORY)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Not enough binding points available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x374);
    goto LAB_01486297;
  }
  local_1d8 = 0;
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init((deRandom *)local_1b0,dVar8 ^ 0xff23a4);
  EVar3 = this->m_errorType;
  if (EVar3 == ERRORTYPE_CONTRADICTORY) {
    iVar13._M_current =
         (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_vertexShaderBinding,iVar13,&local_1d8);
    }
    else {
      *iVar13._M_current = local_1d8;
      (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    local_1e8 = (local_1d8 + 1) % iVar7;
    iVar13._M_current =
         (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_fragmentShaderBinding,iVar13,(int *)&local_1e8);
    }
    else {
      *iVar13._M_current = local_1e8;
      (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    local_1e8 = (local_1d8 + 2) % iVar7;
    iVar13._M_current =
         (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_tessCtrlShaderBinding,iVar13,(int *)&local_1e8);
    }
    else {
      *iVar13._M_current = local_1e8;
      (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    local_1e8 = (local_1d8 + 3) % iVar7;
    iVar13._M_current =
         (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
LAB_01485efd:
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_tessEvalShaderBinding,iVar13,(int *)&local_1e8);
      goto LAB_01485f0c;
    }
    *iVar13._M_current = local_1e8;
  }
  else if (EVar3 == ERRORTYPE_LESS_THAN_ZERO) {
    uVar9 = this->m_numBindings;
    dVar8 = deRandom_getUint32((deRandom *)local_1b0);
    local_1e8 = ~(dVar8 % uVar9);
    iVar13._M_current =
         (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_vertexShaderBinding,iVar13,
                 (int *)&local_1e8);
    }
    else {
      *iVar13._M_current = local_1e8;
      (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    iVar13._M_current =
         (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_fragmentShaderBinding,iVar13,
                 (int *)&local_1e8);
    }
    else {
      *iVar13._M_current = local_1e8;
      (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    iVar13._M_current =
         (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_tessCtrlShaderBinding,iVar13,
                 (int *)&local_1e8);
    }
    else {
      *iVar13._M_current = local_1e8;
      (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    iVar13._M_current =
         (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_tessEvalShaderBinding,iVar13,
                 (int *)&local_1e8);
      goto LAB_01485f0c;
    }
    *iVar13._M_current = local_1e8;
  }
  else {
    if (EVar3 != ERRORTYPE_OVER_MAX_UNITS) goto LAB_01485f0c;
    iVar7 = iVar7 + 1;
    local_1e8 = iVar7 - this->m_numBindings;
    iVar13._M_current =
         (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_vertexShaderBinding,iVar13,(int *)&local_1e8);
    }
    else {
      *iVar13._M_current = local_1e8;
      (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    local_1e8 = iVar7 - this->m_numBindings;
    iVar13._M_current =
         (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_fragmentShaderBinding,iVar13,(int *)&local_1e8);
    }
    else {
      *iVar13._M_current = local_1e8;
      (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    local_1e8 = iVar7 - this->m_numBindings;
    iVar13._M_current =
         (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_tessCtrlShaderBinding,iVar13,(int *)&local_1e8);
    }
    else {
      *iVar13._M_current = local_1e8;
      (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    local_1e8 = iVar7 - this->m_numBindings;
    iVar13._M_current =
         (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_01485efd;
    *iVar13._M_current = local_1e8;
  }
  (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)((uint *)iVar13._M_current + 1);
LAB_01485f0c:
  if (1 < this->m_numBindings) {
    local_1c8 = &this->m_vertexShaderBinding;
    iVar7 = 1;
    do {
      local_1e8 = *(this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar7;
      iVar13._M_current =
           (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_1c8,iVar13,(int *)&local_1e8);
      }
      else {
        *iVar13._M_current = local_1e8;
        (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current + 1;
      }
      local_1e8 = *(this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar7;
      iVar13._M_current =
           (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->m_fragmentShaderBinding,iVar13,(int *)&local_1e8);
      }
      else {
        *iVar13._M_current = local_1e8;
        (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current + 1;
      }
      local_1e8 = *(this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar7;
      iVar13._M_current =
           (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->m_tessCtrlShaderBinding,iVar13,(int *)&local_1e8);
      }
      else {
        *iVar13._M_current = local_1e8;
        (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current + 1;
      }
      local_1e8 = *(this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar7;
      iVar13._M_current =
           (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->m_tessEvalShaderBinding,iVar13,(int *)&local_1e8);
      }
      else {
        *iVar13._M_current = local_1e8;
        (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar13._M_current + 1;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < this->m_numBindings);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Creating test shaders",0x15)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  iVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  this->m_program = (ShaderProgram *)CONCAT44(extraout_var_00,iVar7);
  pTVar11 = glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                            (ShaderProgram *)CONCAT44(extraout_var_00,iVar7));
  return (int)pTVar11;
}

Assistant:

void LayoutBindingNegativeCase::init (void)
{
	// Decide appropriate binding points for the vertex and fragment shaders
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	de::Random				rnd					(deStringHash(getName()) ^ 0xff23a4);
	glw::GLint				numBindingPoints	= 0;	// Number of binding points
	glw::GLint				maxVertexUnits		= 0;	// Available uniforms in the vertex shader
	glw::GLint				maxFragmentUnits	= 0;	// Available uniforms in the fragment shader
	glw::GLint				maxCombinedUnits	= 0;	// Available uniforms in all the shader stages combined
	glw::GLint				maxTessCtrlUnits	= 0;	// Available uniforms in tessellation control shader
	glw::GLint				maxTessEvalUnits	= 0;	// Available uniforms in tessellation evaluation shader
	glw::GLint				maxUnits			= 0;	// Maximum available uniforms for this test

	m_tessSupport = m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader")
					|| contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!m_tessSupport && (m_shaderType == SHADERTYPE_TESS_EVALUATION || m_shaderType == SHADERTYPE_TESS_CONTROL))
		TCU_THROW(NotSupportedError, "Tesselation shaders not supported");

	int numShaderStages = m_tessSupport ? 4 : 2;

	gl.getIntegerv(m_maxVertexUnitsEnum, &maxVertexUnits);
	gl.getIntegerv(m_maxFragmentUnitsEnum, &maxFragmentUnits);

	if (m_tessSupport)
	{
		gl.getIntegerv(m_maxTessCtrlUnitsEnum, &maxTessCtrlUnits);
		gl.getIntegerv(m_maxTessEvalUnitsEnum, &maxTessEvalUnits);
	}

	gl.getIntegerv(m_maxCombinedUnitsEnum, &maxCombinedUnits);
	gl.getIntegerv(m_maxBindingPointEnum, &numBindingPoints);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Querying available uniform numbers failed");

	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the vertex shader: " << maxVertexUnits << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the fragment shader: " << maxFragmentUnits << tcu::TestLog::EndMessage;

	if (m_tessSupport)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the tessellation control shader: " << maxTessCtrlUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the tessellation evaluation shader: " << maxTessCtrlUnits << tcu::TestLog::EndMessage;
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum combined units for uniform type: " << maxCombinedUnits << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum binding point for uniform type: " << numBindingPoints-1 << tcu::TestLog::EndMessage;

	// Select maximum number of uniforms used for the test
	switch (m_shaderType)
	{
		case SHADERTYPE_VERTEX:
			maxUnits = maxVertexUnits;
			break;

		case SHADERTYPE_FRAGMENT:
			maxUnits = maxFragmentUnits;
			break;

		case SHADERTYPE_ALL:
			maxUnits = de::min(de::min(de::min(maxVertexUnits, maxFragmentUnits), de::min(maxTessCtrlUnits, maxTessEvalUnits)), maxCombinedUnits/numShaderStages);
			break;

		case SHADERTYPE_TESS_CONTROL:
			maxUnits = maxTessCtrlUnits;
			break;

		case SHADERTYPE_TESS_EVALUATION:
			maxUnits = maxTessEvalUnits;
			break;

		default:
			DE_ASSERT(false);
	}

	// Select the number of uniforms (= bindings) used for this test
	switch (m_testType)
	{
		case TESTTYPE_BINDING_SINGLE:
		case TESTTYPE_BINDING_MAX:
			m_numBindings = 1;
			break;

		case TESTTYPE_BINDING_MULTIPLE:
		case TESTTYPE_BINDING_ARRAY:
		case TESTTYPE_BINDING_MAX_ARRAY:
			if (m_errorType == ERRORTYPE_CONTRADICTORY)
			{
				// leave room for contradictory case
				if (maxUnits < 3)
					TCU_THROW(NotSupportedError, "Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits-1));
			}
			else
			{
				if (maxUnits < 2)
					TCU_THROW(NotSupportedError, "Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits));
			}
			break;

		default:
			DE_ASSERT(false);
	}

	// Check that we have enough uniforms in different shaders to perform the tests
	if (((m_shaderType == SHADERTYPE_VERTEX) || (m_shaderType == SHADERTYPE_ALL)) && (maxVertexUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Vertex shader: not enough uniforms available for test");

	if (((m_shaderType == SHADERTYPE_FRAGMENT) || (m_shaderType == SHADERTYPE_ALL)) && (maxFragmentUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Fragment shader: not enough uniforms available for test");

	if (m_tessSupport && ((m_shaderType == SHADERTYPE_TESS_CONTROL) || (m_shaderType == SHADERTYPE_ALL)) && (maxTessCtrlUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Tessellation control shader: not enough uniforms available for test");

	if (m_tessSupport && ((m_shaderType == SHADERTYPE_TESS_EVALUATION) || (m_shaderType == SHADERTYPE_ALL)) && (maxTessEvalUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Tessellation evaluation shader: not enough uniforms available for test");

	if ((m_shaderType == SHADERTYPE_ALL) && (maxCombinedUnits < m_numBindings*numShaderStages) )
		TCU_THROW(NotSupportedError, "Not enough uniforms available for test");

	// Check that we have enough binding points to perform the tests
	if (numBindingPoints < m_numBindings)
		TCU_THROW(NotSupportedError, "Not enough binding points available for test");

	if (m_errorType == ERRORTYPE_CONTRADICTORY && numBindingPoints == m_numBindings)
		TCU_THROW(NotSupportedError, "Not enough binding points available for test");

	// Initialize the binding points i.e. populate the two binding point vectors
	initBindingPoints(0, numBindingPoints);

	// Generate the shader program - note: this must be done after deciding the binding points
	DE_ASSERT(!m_program);
	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shaders" << tcu::TestLog::EndMessage;
	m_program = generateShaders();
	m_testCtx.getLog() << *m_program;
}